

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.cpp
# Opt level: O2

bool __thiscall
ParsePackage::PackageFuncList
          (ParsePackage *this,char *buf,int *len,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *func_map)

{
  ParsePackage *this_00;
  bool bVar1;
  size_t sVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  bool bVar5;
  char *pcVar6;
  int num;
  char *local_68;
  int local_5c;
  _Base_ptr local_58;
  char *local_50;
  int *local_48;
  ParsePackage *local_40;
  _Base_ptr local_38;
  
  if (buf == (char *)0x0) {
    return false;
  }
  pcVar6 = buf + *len;
  local_5c = (int)(func_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_68 = (char *)CONCAT44(local_68._4_4_,4);
  bVar5 = false;
  local_48 = len;
  bVar1 = _SafeSprintf<MessageType>(this,false,buf,pcVar6,"%d|",(MessageType *)&local_68);
  if (bVar1) {
    pcVar4 = buf + 2;
    bVar5 = false;
    bVar1 = _SafeSprintf<int&>(this,false,pcVar4,pcVar6,"%d|",&local_5c);
    if (bVar1) {
      local_50 = buf;
      sVar2 = strlen(pcVar4);
      pcVar4 = pcVar4 + sVar2;
      local_38 = &(func_map->_M_t)._M_impl.super__Rb_tree_header._M_header;
      p_Var3 = (func_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_40 = this;
      while (this_00 = local_40, p_Var3 != local_38) {
        local_68 = *(char **)(p_Var3 + 1);
        local_58 = p_Var3;
        bVar1 = _SafeSprintf<char_const*>(local_40,false,pcVar4,pcVar6,"%s|",&local_68);
        if (!bVar1) {
          return false;
        }
        sVar2 = strlen(pcVar4);
        pcVar4 = pcVar4 + sVar2;
        local_68 = *(char **)(local_58 + 2);
        bVar1 = _SafeSprintf<char_const*>(this_00,false,pcVar4,pcVar6,"%s|",&local_68);
        if (!bVar1) {
          return false;
        }
        sVar2 = strlen(pcVar4);
        pcVar4 = pcVar4 + sVar2;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(local_58);
      }
      bVar5 = false;
      bVar1 = _SafeSprintf<char_const(&)[5]>
                        (local_40,false,pcVar4,pcVar6,"%s",(char (*) [5])"\r\n\r\n");
      pcVar6 = local_50;
      if (bVar1) {
        sVar2 = strlen(pcVar4);
        *local_48 = ((int)sVar2 + (int)pcVar4) - (int)pcVar6;
        bVar5 = true;
      }
    }
  }
  return bVar5;
}

Assistant:

bool ParsePackage::PackageFuncList(char* buf, int& len, std::map<std::string, std::string>& func_map) {
    if (!buf) {
        return false;
    }

    char* end = buf + len;
    char* cur = buf;
    int num = (int)func_map.size();
    //type
    if (!_SafeSprintf(false, cur, end, "%d|", FUNCTION_INFO))
        return false;
    cur += 2;
    //function num
    if (!_SafeSprintf(false, cur, end, "%d|", num))
        return false;
    cur += strlen(cur);
    
    for (auto iter = func_map.begin(); iter != func_map.end(); ++iter) {
        if (!_SafeSprintf(false, cur, end, "%s|", iter->first.c_str()))
            return false;
        cur += strlen(cur);

        if (!_SafeSprintf(false, cur, end, "%s|", iter->second.c_str()))
            return false;
        cur += strlen(cur);
    }
    if (!_SafeSprintf(false, cur, end, "%s", "\r\n\r\n"))
        return false;
    cur += strlen(cur);
    len = cur - buf;
    return true;
}